

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
(anonymous_namespace)::KeyParser::
FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (KeyParser *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ParseScriptContext PVar5;
  ulong uVar6;
  pointer *__ptr;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  local_a8;
  CPubKey pubkey_1;
  XOnlyPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 8) == 0) {
    __assert_fail("m_in",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6b2,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  bVar4 = miniscript::IsTapscript(*(MiniscriptContext *)(this + 0x48));
  if ((long)end._M_current - (long)begin._M_current == 0x20 && bVar4) {
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    if (end._M_current != begin._M_current) {
      pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)begin._M_current
      ;
      pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)(begin._M_current + 8);
      pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)(begin._M_current + 0x10);
      pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)(begin._M_current + 0x18);
    }
    XOnlyPubKey::GetEvenCorrespondingCPubKey(&pubkey_1,&pubkey);
    PVar5 = anon_unknown.dwarf_e9e4d4::KeyParser::ParseContext((KeyParser *)this);
    anon_unknown.dwarf_e9e4d4::InferPubkey
              ((anon_unknown_dwarf_e9e4d4 *)&local_a8,&pubkey_1,PVar5,
               *(SigningProvider **)(this + 8));
    if (local_a8._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         )0x0) {
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::emplace_back<>((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                        *)(this + 0x10));
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)(*(long *)(this + 0x18) + -0x18),&local_a8);
LAB_003231a3:
      if ((tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
           )local_a8._M_t.
            super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl !=
          (_Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>)0x0) {
        (**(code **)(*(long *)local_a8._M_t.
                              super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                              .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>
                              ._M_head_impl + 8))();
      }
      uVar6 = 0x100000000;
      goto LAB_003231bc;
    }
  }
  else {
    bVar4 = miniscript::IsTapscript(*(MiniscriptContext *)(this + 0x48));
    if (!bVar4) {
      CPubKey::
      Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&pubkey_1,begin,end);
      PVar5 = anon_unknown.dwarf_e9e4d4::KeyParser::ParseContext((KeyParser *)this);
      anon_unknown.dwarf_e9e4d4::InferPubkey
                ((anon_unknown_dwarf_e9e4d4 *)&pubkey,&pubkey_1,PVar5,
                 *(SigningProvider **)(this + 8));
      if (pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ != 0) {
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::emplace_back<>((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                          *)(this + 0x10));
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    *)(*(long *)(this + 0x18) + -0x18),
                   (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    *)&pubkey);
        local_a8._M_t.
        super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
             (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
                )pubkey.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
        goto LAB_003231a3;
      }
    }
  }
  uVar6 = 0;
LAB_003231bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)(uVar6 | (lVar3 - lVar2) / 0x18 & 0xffffffffU);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKBytes(I begin, I end) const
    {
        assert(m_in);
        Key key = m_keys.size();
        if (miniscript::IsTapscript(m_script_ctx) && end - begin == 32) {
            XOnlyPubKey pubkey;
            std::copy(begin, end, pubkey.begin());
            if (auto pubkey_provider = InferPubkey(pubkey.GetEvenCorrespondingCPubKey(), ParseContext(), *m_in)) {
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        } else if (!miniscript::IsTapscript(m_script_ctx)) {
            CPubKey pubkey(begin, end);
            if (auto pubkey_provider = InferPubkey(pubkey, ParseContext(), *m_in)) {
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        }
        return {};
    }